

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  sqvector<char,_unsigned_int> *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  SQInteger SVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  LexChar LVar9;
  DiagnosticsId diagId;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  bool bVar14;
  int i;
  SQUnsignedInteger SVar15;
  SQFloat value;
  SQChar *sTemp;
  char local_45 [5];
  sqvector<char,_unsigned_int> *local_40;
  ulong uVar13;
  
  LVar9 = this->_currdata;
  this_00 = &this->_longstr;
  local_45[0] = '\0';
  sqvector<char,_unsigned_int>::resize(this_00,0,local_45);
  uVar6 = this->_sourceTextPtr;
  uVar13 = this->_currentcolumn;
  uVar10 = uVar13;
  do {
    uVar10 = uVar10 + 1;
    if (uVar6 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar6 + 1;
      bVar11 = this->_sourceText[uVar6];
      uVar6 = uVar6 + 1;
    }
    else {
      this->_reached_eof = 1;
      bVar11 = 0;
    }
    this->_currdata = bVar11;
    this->_currentcolumn = uVar10;
    uVar12 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar12;
  } while (bVar11 == 0x5f);
  if ((LVar9 == '0') && (bVar11 - 0x30 < 10)) {
    iVar3 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_OCTAL_NOT_SUPPORTED,(int32_t)this->_tokenline,iVar3,uVar12 - iVar3);
  }
  local_40 = this_00;
  if ((LVar9 == '0') && (iVar3 = toupper((uint)this->_currdata), iVar3 == 0x58)) {
    uVar6 = this->_sourceTextPtr;
    lVar7 = this->_currentcolumn;
    do {
      lVar7 = lVar7 + 1;
      if (uVar6 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar6 + 1;
        LVar9 = this->_sourceText[uVar6];
        uVar6 = uVar6 + 1;
      }
      else {
        this->_reached_eof = 1;
        LVar9 = '\0';
      }
      this->_currdata = LVar9;
      this->_currentcolumn = lVar7;
    } while (LVar9 == '_');
    bVar11 = this->_currdata;
    iVar3 = isxdigit((uint)bVar11);
    while (iVar3 != 0) {
      uVar12 = (this->_longstr)._size;
      uVar1 = (this->_longstr)._allocated;
      if (uVar1 <= uVar12) {
        uVar12 = uVar12 * 2;
        if (uVar12 == 0) {
          uVar12 = 4;
        }
        pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                       (ulong)uVar1,(ulong)uVar12);
        (this->_longstr)._vals = pcVar4;
        (this->_longstr)._allocated = uVar12;
      }
      uVar12 = (this->_longstr)._size;
      (this->_longstr)._size = uVar12 + 1;
      (this->_longstr)._vals[uVar12] = bVar11;
      uVar6 = this->_sourceTextPtr;
      lVar7 = this->_currentcolumn;
      do {
        lVar7 = lVar7 + 1;
        if (uVar6 < this->_sourceTextSize) {
          this->_sourceTextPtr = uVar6 + 1;
          LVar9 = this->_sourceText[uVar6];
          uVar6 = uVar6 + 1;
        }
        else {
          this->_reached_eof = 1;
          LVar9 = '\0';
        }
        this->_currdata = LVar9;
        this->_currentcolumn = lVar7;
      } while (LVar9 == '_');
      bVar11 = this->_currdata;
      iVar3 = isxdigit((uint)bVar11);
    }
    if (0x10 < (this->_longstr)._size) {
      iVar3 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_HEX_TOO_MANY_DIGITS,(int32_t)this->_tokenline,iVar3,
                 (int)this->_currentcolumn - iVar3);
    }
    lVar7 = 3;
    if ((this->_longstr)._size == 0) {
      iVar3 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_HEX_DIGITS_EXPECTED,(int32_t)this->_tokenline,iVar3,
                 (int)this->_currentcolumn - iVar3);
    }
LAB_0013888b:
    uVar12 = (this->_longstr)._size;
    uVar1 = (this->_longstr)._allocated;
    if (uVar1 <= uVar12) {
      uVar12 = uVar12 * 2;
      SVar15 = 4;
      if (uVar12 != 0) {
        SVar15 = (SQUnsignedInteger)uVar12;
      }
      pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,(ulong)uVar1
                                     ,SVar15);
      (this->_longstr)._vals = pcVar4;
      (this->_longstr)._allocated = (size_type)SVar15;
    }
    uVar12 = (this->_longstr)._size;
    (this->_longstr)._size = uVar12 + 1;
    (this->_longstr)._vals[uVar12] = '\0';
    SVar5 = (*(code *)(&DAT_0017d8f0 + *(int *)(&DAT_0017d8f0 + (lVar7 + -1) * 4)))();
    return SVar5;
  }
  uVar12 = (this->_longstr)._size;
  uVar1 = (this->_longstr)._allocated;
  if (uVar1 <= uVar12) {
    uVar12 = uVar12 * 2;
    SVar15 = 4;
    if (uVar12 != 0) {
      SVar15 = (SQUnsignedInteger)uVar12;
    }
    pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,(ulong)uVar1,
                                   SVar15);
    (this->_longstr)._vals = pcVar4;
    (this->_longstr)._allocated = (size_type)SVar15;
  }
  uVar12 = (this->_longstr)._size;
  (this->_longstr)._size = uVar12 + 1;
  (this->_longstr)._vals[uVar12] = LVar9;
  lVar7 = 1;
  bVar2 = false;
  bVar14 = false;
  do {
    bVar11 = this->_currdata;
    if (bVar11 == 0x2e) {
LAB_00138a52:
      diagId = DI_MALFORMED_NUMBER;
      if (bVar14) {
        bVar14 = true;
        lVar7 = 2;
      }
      else {
        bVar14 = true;
        lVar7 = 2;
        if (!bVar2) goto LAB_00138c27;
      }
LAB_00138c09:
      iVar3 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,diagId,(int32_t)this->_tokenline,iVar3,(int)this->_currentcolumn - iVar3
                );
    }
    else {
      iVar3 = isalnum((uint)bVar11);
      if (iVar3 == 0) goto LAB_0013888b;
      if (bVar11 == 0x2e) goto LAB_00138a52;
      if ((bVar11 & 0xdf) == 0x45) {
        if (bVar2) {
          iVar3 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar3,
                     (int)this->_currentcolumn - iVar3);
        }
        LVar9 = this->_currdata;
        uVar12 = (this->_longstr)._allocated;
        uVar1 = (this->_longstr)._size;
        if (uVar12 <= uVar1) {
          uVar1 = uVar1 * 2;
          if (uVar1 == 0) {
            uVar1 = 4;
          }
          pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                         (ulong)uVar12,(ulong)uVar1);
          (this->_longstr)._vals = pcVar4;
          (this->_longstr)._allocated = uVar1;
        }
        uVar12 = (this->_longstr)._size;
        (this->_longstr)._size = uVar12 + 1;
        (this->_longstr)._vals[uVar12] = LVar9;
        uVar6 = this->_sourceTextPtr;
        if (uVar6 < this->_sourceTextSize) {
          this->_sourceTextPtr = uVar6 + 1;
          LVar9 = this->_sourceText[uVar6];
        }
        else {
          this->_reached_eof = 1;
          LVar9 = '\0';
        }
        this->_currdata = LVar9;
        this->_currentcolumn = this->_currentcolumn + 1;
        if ((LVar9 == '-') || (LVar9 == '+')) {
          uVar12 = (this->_longstr)._size;
          uVar1 = (this->_longstr)._allocated;
          if (uVar1 <= uVar12) {
            uVar12 = uVar12 * 2;
            if (uVar12 == 0) {
              uVar12 = 4;
            }
            pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                           (ulong)uVar1,(ulong)uVar12);
            (this->_longstr)._vals = pcVar4;
            (this->_longstr)._allocated = uVar12;
          }
          uVar12 = (this->_longstr)._size;
          (this->_longstr)._size = uVar12 + 1;
          (this->_longstr)._vals[uVar12] = LVar9;
          uVar6 = this->_sourceTextPtr;
          if (uVar6 < this->_sourceTextSize) {
            this->_sourceTextPtr = uVar6 + 1;
            LVar9 = this->_sourceText[uVar6];
          }
          else {
            this->_reached_eof = 1;
            LVar9 = '\0';
          }
          this->_currdata = LVar9;
          this->_currentcolumn = this->_currentcolumn + 1;
        }
        diagId = DI_FP_EXP_EXPECTED;
        bVar2 = true;
        lVar7 = 4;
        if (this->_currdata - 0x30 < 10) goto LAB_00138c27;
        goto LAB_00138c09;
      }
    }
LAB_00138c27:
    if ((9 < this->_currdata - 0x30) &&
       ((uVar12 = this->_currdata - 0x2e, 0x37 < uVar12 ||
        ((0x80000000800001U >> ((ulong)uVar12 & 0x3f) & 1) == 0)))) {
      iVar3 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar3,
                 (int)this->_currentcolumn - iVar3);
    }
    LVar9 = this->_currdata;
    uVar12 = (this->_longstr)._allocated;
    uVar1 = (this->_longstr)._size;
    if (uVar12 <= uVar1) {
      uVar1 = uVar1 * 2;
      if (uVar1 == 0) {
        uVar1 = 4;
      }
      pcVar4 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,
                                     (ulong)uVar12,(ulong)uVar1);
      (this->_longstr)._vals = pcVar4;
      (this->_longstr)._allocated = uVar1;
    }
    uVar12 = (this->_longstr)._size;
    (this->_longstr)._size = uVar12 + 1;
    (this->_longstr)._vals[uVar12] = LVar9;
    uVar6 = this->_sourceTextPtr;
    lVar8 = this->_currentcolumn;
    do {
      lVar8 = lVar8 + 1;
      if (uVar6 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar6 + 1;
        LVar9 = this->_sourceText[uVar6];
        uVar6 = uVar6 + 1;
      }
      else {
        this->_reached_eof = 1;
        LVar9 = '\0';
      }
      this->_currdata = LVar9;
      this->_currentcolumn = lVar8;
    } while (LVar9 == '_');
  } while( true );
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4

    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    volatile SQFloat value;
    INIT_TEMP_STRING();
    NUM_NEXT();
    if(firstchar == _SC('0') && isdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_OCTAL_NOT_SUPPORTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X')) ) {
        NUM_NEXT();
        type = THEX;
        while(isxdigit(CUR_CHAR)) {
            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
        if(_longstr.size() > MAX_HEX_DIGITS)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_TOO_MANY_DIGITS, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(_longstr.size() == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_DIGITS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    }
    else {
        APPEND_CHAR((SQChar)firstchar);
        bool hasExp = false;
        bool hasDot = false;
        while (CUR_CHAR == _SC('.') || isalnum(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.')) {
                if(hasDot || hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasDot = true;
                type = TFLOAT;
            }
            else if(isexponent(CUR_CHAR)) {
                if(hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasExp = true;
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!isdigit(CUR_CHAR))
                    _ctx.reportDiagnostic(DiagnosticsId::DI_FP_EXP_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
            }
            if(!isdigit(CUR_CHAR) && !isexponent(CUR_CHAR) && CUR_CHAR != '.')
                _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);

            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
#if SQ_USE_STD_FROM_CHARS
        {
            auto ret = std::from_chars(&_longstr[0], &_longstr[0] + _longstr.size(), _fvalue);
            if (ret.ec == std::errc::result_out_of_range)
                _ctx.reportDiagnostic(_fvalue == 0 ? DiagnosticsId::DI_LITERAL_UNDERFLOW : DiagnosticsId::DI_LITERAL_OVERFLOW,
                    _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");

            for (const char * c = ret.ptr; c < &_longstr[0] + _longstr.size() - 1; ++c)
                if (*c != '0')
                {
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                }
        }
#else
        value = (SQFloat)strtod(&_longstr[0], &sTemp);
        _fvalue = value;
        if(value == 0)
        {
            for(int i = 0; i < _longstr.size(); i++)
            {
                SQChar c = _longstr[i];
                if (!c || c == 'e' || c == 'E')
                    break;
                if (c != '.' && c != '0')
                    _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_UNDERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
            }
        }
#endif

        if(sizeof(_fvalue) == sizeof(float))
        {
            if (_fvalue >= FLT_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        else if(sizeof(_fvalue) == sizeof(double))
        {
            if (_fvalue >= DBL_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        return TK_FLOAT;
    case TINT:
        if(!LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue))
            _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "integer");
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}